

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

uint8_t * __thiscall
edition_unittest::Int32ParseTester::_InternalSerialize
          (Int32ParseTester *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  RepeatedField<int> *pRVar1;
  int *piVar2;
  int iVar3;
  uint8_t *puVar4;
  const_pointer piVar5;
  byte *pbVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  LogMessageFatal local_40;
  
  uVar8 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar8 & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                       (stream,(this->field_0)._impl_.optional_int32_lowfield_,target);
  }
  uVar9 = *(uint *)((long)&this->field_0 + 0x30);
  if (0 < (int)uVar9) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar4) goto LAB_009da9bf;
    pRVar1 = &(this->field_0)._impl_.repeated_int32_lowfield_;
    *puVar4 = '\x12';
    target = puVar4 + 2;
    for (; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-1] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar9;
    piVar5 = google::protobuf::RepeatedField<int>::data(pRVar1);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
    piVar2 = piVar5 + iVar3;
    do {
      pbVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar7 = (ulong)*piVar5; target = pbVar6 + 1, 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        *pbVar6 = (byte)uVar7 | 0x80;
        pbVar6 = target;
      }
      piVar5 = piVar5 + 1;
      *pbVar6 = (byte)uVar7;
    } while (piVar5 < piVar2);
  }
  uVar9 = *(uint *)((long)&this->field_0 + 0x48);
  if (0 < (int)uVar9) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar4) goto LAB_009da9bf;
    pRVar1 = &(this->field_0)._impl_.packed_int32_lowfield_;
    *puVar4 = '\x1a';
    target = puVar4 + 2;
    for (; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-1] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar9;
    piVar5 = google::protobuf::RepeatedField<int>::data(pRVar1);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
    piVar2 = piVar5 + iVar3;
    do {
      pbVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar7 = (ulong)*piVar5; target = pbVar6 + 1, 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        *pbVar6 = (byte)uVar7 | 0x80;
        pbVar6 = target;
      }
      piVar5 = piVar5 + 1;
      *pbVar6 = (byte)uVar7;
    } while (piVar5 < piVar2);
  }
  if ((uVar8 & 4) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                       (99,(this->field_0)._impl_.other_field_,puVar4);
  }
  if ((uVar8 & 2) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                       (0x3e9,(this->field_0)._impl_.optional_int32_midfield_,puVar4);
  }
  uVar9 = *(uint *)((long)&this->field_0 + 0x60);
  if (0 < (int)uVar9) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar4) goto LAB_009da9bf;
    pRVar1 = &(this->field_0)._impl_.repeated_int32_midfield_;
    puVar4[0] = 0xd2;
    puVar4[1] = '>';
    target = puVar4 + 3;
    for (; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-1] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar9;
    piVar5 = google::protobuf::RepeatedField<int>::data(pRVar1);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
    piVar2 = piVar5 + iVar3;
    do {
      pbVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar7 = (ulong)*piVar5; target = pbVar6 + 1, 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        *pbVar6 = (byte)uVar7 | 0x80;
        pbVar6 = target;
      }
      piVar5 = piVar5 + 1;
      *pbVar6 = (byte)uVar7;
    } while (piVar5 < piVar2);
  }
  uVar9 = *(uint *)((long)&this->field_0 + 0x78);
  if (0 < (int)uVar9) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar4) goto LAB_009da9bf;
    pRVar1 = &(this->field_0)._impl_.packed_int32_midfield_;
    puVar4[0] = 0xda;
    puVar4[1] = '>';
    target = puVar4 + 3;
    for (; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-1] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar9;
    piVar5 = google::protobuf::RepeatedField<int>::data(pRVar1);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
    piVar2 = piVar5 + iVar3;
    do {
      pbVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar7 = (ulong)*piVar5; target = pbVar6 + 1, 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        *pbVar6 = (byte)uVar7 | 0x80;
        pbVar6 = target;
      }
      piVar5 = piVar5 + 1;
      *pbVar6 = (byte)uVar7;
    } while (piVar5 < piVar2);
  }
  if ((uVar8 & 8) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                       (0xf4241,(this->field_0)._impl_.optional_int32_hifield_,puVar4);
  }
  uVar8 = *(uint *)((long)&this->field_0 + 0x90);
  if (0 < (int)uVar8) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar4) goto LAB_009da9bf;
    pRVar1 = &(this->field_0)._impl_.repeated_int32_hifield_;
    puVar4[0] = 0x92;
    puVar4[1] = 0xa4;
    puVar4[2] = 0xe8;
    puVar4[3] = '\x03';
    target = puVar4 + 5;
    for (; 0x7f < uVar8; uVar8 = uVar8 >> 7) {
      target[-1] = (byte)uVar8 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar8;
    piVar5 = google::protobuf::RepeatedField<int>::data(pRVar1);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
    piVar2 = piVar5 + iVar3;
    do {
      pbVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar7 = (ulong)*piVar5; target = pbVar6 + 1, 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        *pbVar6 = (byte)uVar7 | 0x80;
        pbVar6 = target;
      }
      piVar5 = piVar5 + 1;
      *pbVar6 = (byte)uVar7;
    } while (piVar5 < piVar2);
  }
  uVar8 = *(uint *)((long)&this->field_0 + 0xa8);
  if (0 < (int)uVar8) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar4) {
LAB_009da9bf:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
    }
    pRVar1 = &(this->field_0)._impl_.packed_int32_hifield_;
    puVar4[0] = 0x9a;
    puVar4[1] = 0xa4;
    puVar4[2] = 0xe8;
    puVar4[3] = '\x03';
    target = puVar4 + 5;
    for (; 0x7f < uVar8; uVar8 = uVar8 >> 7) {
      target[-1] = (byte)uVar8 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar8;
    piVar5 = google::protobuf::RepeatedField<int>::data(pRVar1);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
    piVar2 = piVar5 + iVar3;
    do {
      pbVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar7 = (ulong)*piVar5; target = pbVar6 + 1, 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        *pbVar6 = (byte)uVar7 | 0x80;
        pbVar6 = target;
      }
      piVar5 = piVar5 + 1;
      *pbVar6 = (byte)uVar7;
    } while (piVar5 < piVar2);
  }
  puVar4 = google::protobuf::internal::ExtensionSet::_InternalSerializeAll
                     (&(this->field_0)._impl_._extensions_,
                      (MessageLite *)_Int32ParseTester_default_instance_,target,stream);
  uVar7 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar7 & 1) == 0) {
    return puVar4;
  }
  puVar4 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar7 & 0xfffffffffffffffe) + 8),puVar4,stream);
  return puVar4;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL Int32ParseTester::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const Int32ParseTester& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.Int32ParseTester)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int32 optional_int32_lowfield = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_optional_int32_lowfield(), target);
  }

  // repeated int32 repeated_int32_lowfield = 2;
  {
    int byte_size = this_._impl_._repeated_int32_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          2, this_._internal_repeated_int32_lowfield(), byte_size, target);
    }
  }

  // repeated int32 packed_int32_lowfield = 3 [features = {
  {
    int byte_size = this_._impl_._packed_int32_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          3, this_._internal_packed_int32_lowfield(), byte_size, target);
    }
  }

  // int32 other_field = 99;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        99, this_._internal_other_field(), target);
  }

  // int32 optional_int32_midfield = 1001;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        1001, this_._internal_optional_int32_midfield(), target);
  }

  // repeated int32 repeated_int32_midfield = 1002;
  {
    int byte_size = this_._impl_._repeated_int32_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1002, this_._internal_repeated_int32_midfield(), byte_size, target);
    }
  }

  // repeated int32 packed_int32_midfield = 1003 [features = {
  {
    int byte_size = this_._impl_._packed_int32_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1003, this_._internal_packed_int32_midfield(), byte_size, target);
    }
  }

  // int32 optional_int32_hifield = 1000001;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        1000001, this_._internal_optional_int32_hifield(), target);
  }

  // repeated int32 repeated_int32_hifield = 1000002;
  {
    int byte_size = this_._impl_._repeated_int32_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1000002, this_._internal_repeated_int32_hifield(), byte_size, target);
    }
  }

  // repeated int32 packed_int32_hifield = 1000003 [features = {
  {
    int byte_size = this_._impl_._packed_int32_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1000003, this_._internal_packed_int32_hifield(), byte_size, target);
    }
  }

  // All extensions.
  target = this_._impl_._extensions_._InternalSerializeAll(&default_instance(),
                                                    target, stream);
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.Int32ParseTester)
  return target;
}